

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImFont::RenderText(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,
                  ImVec4 *clip_rect,char *text_begin,char *text_end,float wrap_width,
                  bool cpu_fine_clip)

{
  char cVar1;
  ImDrawIdx *pIVar2;
  ImDrawVert *pIVar3;
  char *pcVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  ImFontGlyph *pIVar8;
  value_type *pvVar9;
  int iVar10;
  char *pcVar11;
  char *pcVar12;
  ImDrawIdx IVar13;
  char *pcVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  uint c;
  ImVec4 *local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  ImDrawIdx *local_b8;
  ImDrawVert *local_b0;
  int local_a4;
  int local_a0;
  ImU32 local_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  ulong local_70;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  ImVector<unsigned_short> *local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  fVar24 = pos.x;
  fVar17 = pos.y;
  local_9c = col;
  local_88 = size;
  if (text_end == (char *)0x0) {
    fStack_60 = in_XMM1_Dc;
    local_68 = (undefined1  [8])pos;
    fStack_5c = in_XMM1_Dd;
    sVar6 = strlen(text_begin);
    text_end = text_begin + sVar6;
    fVar24 = (float)local_68._0_4_;
    fVar17 = (float)local_68._4_4_;
    in_XMM1_Dc = fStack_60;
    in_XMM1_Dd = fStack_5c;
  }
  local_98 = (this->DisplayOffset).x + (float)(int)fVar24;
  fStack_94 = (this->DisplayOffset).y + (float)(int)fVar17;
  fStack_90 = (float)(int)in_XMM1_Dc + 0.0;
  fStack_8c = (float)(int)in_XMM1_Dd + 0.0;
  if (fStack_94 < clip_rect->w || fStack_94 == clip_rect->w) {
    local_88 = local_88 / this->FontSize;
    fVar24 = this->FontSize * local_88;
    if ((wrap_width <= 0.0) && (fStack_94 + fVar24 < clip_rect->y)) {
      for (; (text_begin < text_end && (*text_begin != '\n')); text_begin = text_begin + 1) {
      }
    }
    iVar10 = (int)text_end - (int)text_begin;
    local_a0 = iVar10 * 6;
    local_50 = &draw_list->IdxBuffer;
    local_a4 = (draw_list->IdxBuffer).Size;
    local_d0 = clip_rect;
    ImDrawList::PrimReserve(draw_list,local_a0,iVar10 * 4);
    local_b0 = draw_list->_VtxWritePtr;
    local_b8 = draw_list->_IdxWritePtr;
    local_70 = (ulong)draw_list->_VtxCurrentIdx;
    local_48 = local_88;
    fStack_44 = local_88;
    fStack_40 = local_88;
    fStack_3c = local_88;
    pcVar7 = (char *)0x0;
    fVar17 = local_98;
    fVar16 = fStack_94;
    fVar26 = fStack_90;
    fVar27 = fStack_8c;
    fVar28 = local_98;
    fVar29 = fStack_94;
    fVar30 = fStack_90;
    fVar21 = fStack_8c;
    fVar25 = local_98;
    fVar23 = fStack_90;
    fVar22 = fStack_8c;
    local_c8 = local_98;
    fStack_c4 = fStack_94;
    fStack_c0 = fStack_90;
    fStack_bc = fStack_8c;
    pcVar14 = pcVar7;
    pcVar11 = text_begin;
LAB_00180629:
    if (text_begin < text_end) {
      pcVar12 = pcVar11;
      pcVar4 = pcVar14;
      fVar15 = fVar28;
      fVar18 = fVar29;
      fVar19 = fVar30;
      fVar20 = fVar21;
      if (wrap_width <= 0.0) {
LAB_001806f0:
        pcVar7 = pcVar4;
        c = (uint)*pcVar12;
        local_c8 = fVar15;
        fStack_c4 = fVar18;
        fStack_c0 = fVar19;
        fStack_bc = fVar20;
        if (*pcVar12 < '\0') {
          iVar10 = ImTextCharFromUtf8(&c,pcVar12,text_end);
          if (c == 0) goto LAB_00180a83;
          text_begin = pcVar12 + iVar10;
          fVar25 = local_98;
          fVar23 = fStack_90;
          fVar22 = fStack_8c;
        }
        else {
          text_begin = pcVar12 + 1;
        }
        pcVar14 = pcVar7;
        pcVar11 = text_begin;
        if (c < 0x20) {
          fVar17 = local_c8;
          fVar16 = fStack_c4;
          fVar26 = fStack_c0;
          fVar27 = fStack_bc;
          fVar28 = local_c8;
          fVar29 = fStack_c4;
          fVar30 = fStack_c0;
          fVar21 = fStack_bc;
          if (c == 0xd) goto LAB_00180629;
          if (c == 10) {
            fVar16 = fStack_c4 + fVar24;
            if (local_d0->w <= fVar16 && fVar16 != local_d0->w) goto LAB_00180a83;
            fVar17 = fVar25;
            fVar26 = fVar23;
            fVar27 = fVar22;
            fVar28 = fVar25;
            fVar29 = fVar16;
            fVar30 = fVar23;
            fVar21 = fVar22;
            local_c8 = fVar25;
            fStack_c4 = fVar16;
            fStack_c0 = fVar23;
            fStack_bc = fVar22;
            if ((wrap_width <= 0.0) && (fVar16 + fVar24 < local_d0->y)) {
              for (; (pcVar11 = text_begin, text_begin < text_end && (*text_begin != '\n'));
                  text_begin = text_begin + 1) {
              }
            }
            goto LAB_00180629;
          }
        }
        pIVar8 = FindGlyph(this,(ImWchar)c);
        if (pIVar8 == (ImFontGlyph *)0x0) {
          fVar17 = 0.0;
        }
        else {
          fVar17 = pIVar8->AdvanceX * local_88;
          if ((c != 9) && (c != 0x20)) {
            fVar26 = pIVar8->X0 * local_48 + local_c8;
            fVar27 = pIVar8->Y0 * fStack_44 + fStack_c4;
            fVar28 = pIVar8->X1 * fStack_40 + local_c8;
            fVar29 = pIVar8->Y1 * fStack_3c + fStack_c4;
            fVar16 = local_d0->z;
            if ((fVar26 <= fVar16) && (fVar30 = local_d0->x, fVar30 <= fVar28)) {
              fVar21 = pIVar8->U0;
              fVar25 = pIVar8->V0;
              fVar23 = pIVar8->U1;
              fVar22 = pIVar8->V1;
              if (cpu_fine_clip) {
                if (fVar26 < fVar30) {
                  fVar21 = fVar21 + (fVar23 - fVar21) *
                                    (1.0 - (fVar28 - fVar30) / (fVar28 - fVar26));
                  fVar26 = fVar30;
                }
                fVar30 = local_d0->y;
                if (fVar27 < fVar30) {
                  fVar25 = fVar25 + (fVar22 - fVar25) *
                                    (1.0 - (fVar29 - fVar30) / (fVar29 - fVar27));
                  fVar27 = fVar30;
                }
                if (fVar16 < fVar28) {
                  fVar23 = (fVar23 - fVar21) * ((fVar16 - fVar26) / (fVar28 - fVar26)) + fVar21;
                  fVar28 = fVar16;
                }
                fVar16 = local_d0->w;
                if (fVar16 < fVar29) {
                  fVar22 = (fVar22 - fVar25) * ((fVar16 - fVar27) / (fVar29 - fVar27)) + fVar25;
                  fVar29 = fVar16;
                }
                if (fVar29 <= fVar27) goto LAB_001808d3;
              }
              IVar13 = (ImDrawIdx)local_70;
              *local_b8 = IVar13;
              local_b8[1] = IVar13 + 1;
              local_b8[2] = IVar13 + 2;
              local_b8[3] = IVar13;
              local_b8[4] = IVar13 + 2;
              local_b8[5] = IVar13 + 3;
              (local_b0->pos).x = fVar26;
              (local_b0->pos).y = fVar27;
              local_b0->col = local_9c;
              (local_b0->uv).x = fVar21;
              (local_b0->uv).y = fVar25;
              local_b0[1].pos.x = fVar28;
              local_b0[1].pos.y = fVar27;
              local_b0[1].col = local_9c;
              local_b0[1].uv.x = fVar23;
              local_b0[1].uv.y = fVar25;
              local_b0[2].pos.x = fVar28;
              local_b0[2].pos.y = fVar29;
              local_b0[2].col = local_9c;
              local_b0[2].uv.x = fVar23;
              local_b0[2].uv.y = fVar22;
              local_b0[3].pos.x = fVar26;
              local_b0[3].pos.y = fVar29;
              local_b0[3].col = local_9c;
              local_b0[3].uv.x = fVar21;
              local_b0[3].uv.y = fVar22;
              local_b0 = local_b0 + 4;
              local_70 = (ulong)((int)local_70 + 4);
              local_b8 = local_b8 + 6;
            }
          }
        }
LAB_001808d3:
        fVar17 = local_c8 + fVar17;
        fVar16 = fStack_c4;
        fVar26 = fStack_c0;
        fVar27 = fStack_bc;
        fVar28 = fVar17;
        fVar29 = fStack_c4;
        fVar30 = fStack_c0;
        fVar21 = fStack_bc;
        fVar25 = local_98;
        fVar23 = fStack_90;
        fVar22 = fStack_8c;
        local_c8 = fVar17;
        goto LAB_00180629;
      }
      fVar15 = fVar17;
      fVar18 = fVar16;
      fVar19 = fVar26;
      fVar20 = fVar27;
      if (pcVar7 == (char *)0x0) {
        local_68._4_4_ = fVar16;
        local_68._0_4_ = fVar17;
        fStack_60 = fVar26;
        fStack_5c = fVar27;
        pcVar7 = CalcWordWrapPositionA
                           (this,local_88,text_begin,text_end,(fVar25 - fVar17) + wrap_width);
        pcVar7 = pcVar7 + (pcVar7 == text_begin);
        fVar15 = (float)local_68._0_4_;
        fVar18 = (float)local_68._4_4_;
        fVar19 = fStack_60;
        fVar20 = fStack_5c;
        fVar28 = local_c8;
        fVar29 = fStack_c4;
        fVar30 = fStack_c0;
        fVar21 = fStack_bc;
        fVar25 = local_98;
        fVar23 = fStack_90;
        fVar22 = fStack_8c;
      }
      pcVar12 = text_begin;
      pcVar4 = pcVar7;
      if (text_begin < pcVar7) goto LAB_001806f0;
      pcVar7 = text_begin;
      do {
        text_begin = pcVar7;
        fVar17 = fVar25;
        fVar16 = fVar18 + fVar24;
        fVar26 = fVar23;
        fVar27 = fVar22;
        if (text_end <= text_begin) {
          pcVar7 = (char *)0x0;
          goto LAB_00180629;
        }
        cVar1 = *text_begin;
        pcVar7 = text_begin + 1;
      } while ((cVar1 == '\t') || (cVar1 == ' '));
      pcVar12 = text_begin + 1;
      if (cVar1 != '\n') {
        pcVar12 = text_begin;
      }
      pcVar7 = (char *)0x0;
      text_begin = pcVar12;
      goto LAB_00180629;
    }
LAB_00180a83:
    pIVar3 = local_b0;
    ImVector<ImDrawVert>::resize
              (&draw_list->VtxBuffer,
               (int)(((long)local_b0 - (long)(draw_list->VtxBuffer).Data) / 0x14));
    pIVar2 = local_b8;
    ImVector<unsigned_short>::resize
              (local_50,(int)((ulong)((long)local_b8 - (long)(draw_list->IdxBuffer).Data) >> 1));
    iVar10 = (draw_list->IdxBuffer).Size;
    iVar5 = local_a0 + local_a4;
    pvVar9 = ImVector<ImDrawCmd>::operator[](&draw_list->CmdBuffer,(draw_list->CmdBuffer).Size + -1)
    ;
    pvVar9->ElemCount = pvVar9->ElemCount + (iVar10 - iVar5);
    draw_list->_VtxWritePtr = pIVar3;
    draw_list->_IdxWritePtr = pIVar2;
    draw_list->_VtxCurrentIdx = (draw_list->VtxBuffer).Size;
  }
  return;
}

Assistant:

void ImFont::RenderText(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, const ImVec4& clip_rect, const char* text_begin, const char* text_end, float wrap_width, bool cpu_fine_clip) const
{
    if (!text_end)
        text_end = text_begin + strlen(text_begin); // ImGui functions generally already provides a valid text_end, so this is merely to handle direct calls.

    // Align to be pixel perfect
    pos.x = (float)(int)pos.x + DisplayOffset.x;
    pos.y = (float)(int)pos.y + DisplayOffset.y;
    float x = pos.x;
    float y = pos.y;
    if (y > clip_rect.w)
        return;

    const float scale = size / FontSize;
    const float line_height = FontSize * scale;
    const bool word_wrap_enabled = (wrap_width > 0.0f);
    const char* word_wrap_eol = NULL;

    // Skip non-visible lines
    const char* s = text_begin;
    if (!word_wrap_enabled && y + line_height < clip_rect.y)
        while (s < text_end && *s != '\n')  // Fast-forward to next line
            s++;

    // Reserve vertices for remaining worse case (over-reserving is useful and easily amortized)
    const int vtx_count_max = (int)(text_end - s) * 4;
    const int idx_count_max = (int)(text_end - s) * 6;
    const int idx_expected_size = draw_list->IdxBuffer.Size + idx_count_max;
    draw_list->PrimReserve(idx_count_max, vtx_count_max);

    ImDrawVert* vtx_write = draw_list->_VtxWritePtr;
    ImDrawIdx* idx_write = draw_list->_IdxWritePtr;
    unsigned int vtx_current_idx = draw_list->_VtxCurrentIdx;

    while (s < text_end)
    {
        if (word_wrap_enabled)
        {
            // Calculate how far we can render. Requires two passes on the string data but keeps the code simple and not intrusive for what's essentially an uncommon feature.
            if (!word_wrap_eol)
            {
                word_wrap_eol = CalcWordWrapPositionA(scale, s, text_end, wrap_width - (x - pos.x));
                if (word_wrap_eol == s) // Wrap_width is too small to fit anything. Force displaying 1 character to minimize the height discontinuity.
                    word_wrap_eol++;    // +1 may not be a character start point in UTF-8 but it's ok because we use s >= word_wrap_eol below
            }

            if (s >= word_wrap_eol)
            {
                x = pos.x;
                y += line_height;
                word_wrap_eol = NULL;

                // Wrapping skips upcoming blanks
                while (s < text_end)
                {
                    const char c = *s;
                    if (ImCharIsBlankA(c)) { s++; } else if (c == '\n') { s++; break; } else { break; }
                }
                continue;
            }
        }

        // Decode and advance source
        unsigned int c = (unsigned int)*s;
        if (c < 0x80)
        {
            s += 1;
        }
        else
        {
            s += ImTextCharFromUtf8(&c, s, text_end);
            if (c == 0) // Malformed UTF-8?
                break;
        }

        if (c < 32)
        {
            if (c == '\n')
            {
                x = pos.x;
                y += line_height;

                if (y > clip_rect.w)
                    break;
                if (!word_wrap_enabled && y + line_height < clip_rect.y)
                    while (s < text_end && *s != '\n')  // Fast-forward to next line
                        s++;
                continue;
            }
            if (c == '\r')
                continue;
        }

        float char_width = 0.0f;
        if (const ImFontGlyph* glyph = FindGlyph((unsigned short)c))
        {
            char_width = glyph->AdvanceX * scale;

            // Arbitrarily assume that both space and tabs are empty glyphs as an optimization
            if (c != ' ' && c != '\t')
            {
                // We don't do a second finer clipping test on the Y axis as we've already skipped anything before clip_rect.y and exit once we pass clip_rect.w
                float x1 = x + glyph->X0 * scale;
                float x2 = x + glyph->X1 * scale;
                float y1 = y + glyph->Y0 * scale;
                float y2 = y + glyph->Y1 * scale;
                if (x1 <= clip_rect.z && x2 >= clip_rect.x)
                {
                    // Render a character
                    float u1 = glyph->U0;
                    float v1 = glyph->V0;
                    float u2 = glyph->U1;
                    float v2 = glyph->V1;

                    // CPU side clipping used to fit text in their frame when the frame is too small. Only does clipping for axis aligned quads.
                    if (cpu_fine_clip)
                    {
                        if (x1 < clip_rect.x)
                        {
                            u1 = u1 + (1.0f - (x2 - clip_rect.x) / (x2 - x1)) * (u2 - u1);
                            x1 = clip_rect.x;
                        }
                        if (y1 < clip_rect.y)
                        {
                            v1 = v1 + (1.0f - (y2 - clip_rect.y) / (y2 - y1)) * (v2 - v1);
                            y1 = clip_rect.y;
                        }
                        if (x2 > clip_rect.z)
                        {
                            u2 = u1 + ((clip_rect.z - x1) / (x2 - x1)) * (u2 - u1);
                            x2 = clip_rect.z;
                        }
                        if (y2 > clip_rect.w)
                        {
                            v2 = v1 + ((clip_rect.w - y1) / (y2 - y1)) * (v2 - v1);
                            y2 = clip_rect.w;
                        }
                        if (y1 >= y2)
                        {
                            x += char_width;
                            continue;
                        }
                    }

                    // We are NOT calling PrimRectUV() here because non-inlined causes too much overhead in a debug builds. Inlined here:
                    {
                        idx_write[0] = (ImDrawIdx)(vtx_current_idx); idx_write[1] = (ImDrawIdx)(vtx_current_idx+1); idx_write[2] = (ImDrawIdx)(vtx_current_idx+2);
                        idx_write[3] = (ImDrawIdx)(vtx_current_idx); idx_write[4] = (ImDrawIdx)(vtx_current_idx+2); idx_write[5] = (ImDrawIdx)(vtx_current_idx+3);
                        vtx_write[0].pos.x = x1; vtx_write[0].pos.y = y1; vtx_write[0].col = col; vtx_write[0].uv.x = u1; vtx_write[0].uv.y = v1;
                        vtx_write[1].pos.x = x2; vtx_write[1].pos.y = y1; vtx_write[1].col = col; vtx_write[1].uv.x = u2; vtx_write[1].uv.y = v1;
                        vtx_write[2].pos.x = x2; vtx_write[2].pos.y = y2; vtx_write[2].col = col; vtx_write[2].uv.x = u2; vtx_write[2].uv.y = v2;
                        vtx_write[3].pos.x = x1; vtx_write[3].pos.y = y2; vtx_write[3].col = col; vtx_write[3].uv.x = u1; vtx_write[3].uv.y = v2;
                        vtx_write += 4;
                        vtx_current_idx += 4;
                        idx_write += 6;
                    }
                }
            }
        }

        x += char_width;
    }

    // Give back unused vertices
    draw_list->VtxBuffer.resize((int)(vtx_write - draw_list->VtxBuffer.Data));
    draw_list->IdxBuffer.resize((int)(idx_write - draw_list->IdxBuffer.Data));
    draw_list->CmdBuffer[draw_list->CmdBuffer.Size-1].ElemCount -= (idx_expected_size - draw_list->IdxBuffer.Size);
    draw_list->_VtxWritePtr = vtx_write;
    draw_list->_IdxWritePtr = idx_write;
    draw_list->_VtxCurrentIdx = (unsigned int)draw_list->VtxBuffer.Size;
}